

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_helper.cc
# Opt level: O0

int bio_ip_and_port_to_socket_and_addr
              (int *out_sock,sockaddr_storage *out_addr,socklen_t *out_addr_length,char *hostname,
              char *port_str)

{
  int iVar1;
  char *pcVar2;
  int local_7c;
  addrinfo *paStack_78;
  int ret;
  addrinfo *cur;
  addrinfo *result;
  addrinfo hint;
  char *port_str_local;
  char *hostname_local;
  socklen_t *out_addr_length_local;
  sockaddr_storage *out_addr_local;
  int *out_sock_local;
  
  *out_sock = -1;
  hint.ai_next = (addrinfo *)port_str;
  OPENSSL_memset(&result,0,0x30);
  result._4_4_ = 0;
  hint.ai_flags = 1;
  iVar1 = getaddrinfo(hostname,(char *)hint.ai_next,(addrinfo *)&result,(addrinfo **)&cur);
  if (iVar1 == 0) {
    local_7c = 0;
    for (paStack_78 = cur; paStack_78 != (addrinfo *)0x0; paStack_78 = paStack_78->ai_next) {
      if (paStack_78->ai_addrlen < 0x81) {
        OPENSSL_memset(out_addr,0,0x80);
        OPENSSL_memcpy(out_addr,paStack_78->ai_addr,(ulong)paStack_78->ai_addrlen);
        *out_addr_length = paStack_78->ai_addrlen;
        iVar1 = socket(paStack_78->ai_family,paStack_78->ai_socktype,paStack_78->ai_protocol);
        *out_sock = iVar1;
        if (*out_sock < 0) {
          ERR_put_error(2,0,0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/socket_helper.cc"
                        ,0x4e);
        }
        else {
          local_7c = 1;
        }
        break;
      }
    }
    freeaddrinfo((addrinfo *)cur);
    out_sock_local._4_4_ = local_7c;
  }
  else {
    ERR_put_error(2,0,0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/socket_helper.cc"
                  ,0x39);
    pcVar2 = gai_strerror(iVar1);
    ERR_add_error_data(1,pcVar2);
    out_sock_local._4_4_ = 0;
  }
  return out_sock_local._4_4_;
}

Assistant:

int bio_ip_and_port_to_socket_and_addr(int *out_sock,
                                       struct sockaddr_storage *out_addr,
                                       socklen_t *out_addr_length,
                                       const char *hostname,
                                       const char *port_str) {
  struct addrinfo hint, *result, *cur;
  int ret;

  *out_sock = -1;

  OPENSSL_memset(&hint, 0, sizeof(hint));
  hint.ai_family = AF_UNSPEC;
  hint.ai_socktype = SOCK_STREAM;

  ret = getaddrinfo(hostname, port_str, &hint, &result);
  if (ret != 0) {
    OPENSSL_PUT_ERROR(SYS, 0);
#if defined(OPENSSL_WINDOWS)
    ERR_add_error_data(1, gai_strerrorA(ret));
#else
    ERR_add_error_data(1, gai_strerror(ret));
#endif
    return 0;
  }

  ret = 0;

  for (cur = result; cur; cur = cur->ai_next) {
    if ((size_t) cur->ai_addrlen > sizeof(struct sockaddr_storage)) {
      continue;
    }
    OPENSSL_memset(out_addr, 0, sizeof(struct sockaddr_storage));
    OPENSSL_memcpy(out_addr, cur->ai_addr, cur->ai_addrlen);
    *out_addr_length = cur->ai_addrlen;

    *out_sock = socket(cur->ai_family, cur->ai_socktype, cur->ai_protocol);
    if (*out_sock < 0) {
      OPENSSL_PUT_SYSTEM_ERROR();
      goto out;
    }

    ret = 1;
    break;
  }

out:
  freeaddrinfo(result);
  return ret;
}